

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyByteFind(char *zStr,sxu32 nLen,sxi32 c,sxu32 *pPos)

{
  char *pcVar1;
  char *pcVar2;
  char *zIn;
  char *pcVar3;
  int iVar4;
  
  if (nLen != 0) {
    pcVar3 = zStr + nLen;
    pcVar1 = zStr + 3;
    do {
      if (pcVar1[-3] == c) {
        if (pPos == (sxu32 *)0x0) {
          return 0;
        }
        iVar4 = (int)pcVar1 + -3;
        goto LAB_001233a3;
      }
      pcVar2 = pcVar1 + -2;
      if (pcVar3 <= pcVar2) {
        return -6;
      }
      if (*pcVar2 == c) {
LAB_0012339e:
        iVar4 = (int)pcVar2;
        if (pPos == (sxu32 *)0x0) {
          return 0;
        }
LAB_001233a3:
        *pPos = iVar4 - (int)zStr;
        return 0;
      }
      pcVar2 = pcVar1 + -1;
      if (pcVar3 <= pcVar2) {
        return -6;
      }
      if (*pcVar2 == c) goto LAB_0012339e;
      if (pcVar3 <= pcVar1) {
        return -6;
      }
      pcVar2 = pcVar1;
      if (*pcVar1 == c) goto LAB_0012339e;
      pcVar2 = pcVar1 + 1;
      pcVar1 = pcVar1 + 4;
    } while (pcVar2 < pcVar3);
  }
  return -6;
}

Assistant:

JX9_PRIVATE sxi32 SyByteFind(const char *zStr, sxu32 nLen, sxi32 c, sxu32 *pPos)
{
	const char *zIn = zStr;
	const char *zEnd;
	
	zEnd = &zIn[nLen];
	for(;;){
		if( zIn >= zEnd ){ break; }if( zIn[0] == c ){ if( pPos ){ *pPos = (sxu32)(zIn - zStr); } return SXRET_OK; } zIn++;
		if( zIn >= zEnd ){ break; }if( zIn[0] == c ){ if( pPos ){ *pPos = (sxu32)(zIn - zStr); } return SXRET_OK; } zIn++;
		if( zIn >= zEnd ){ break; }if( zIn[0] == c ){ if( pPos ){ *pPos = (sxu32)(zIn - zStr); } return SXRET_OK; } zIn++;
		if( zIn >= zEnd ){ break; }if( zIn[0] == c ){ if( pPos ){ *pPos = (sxu32)(zIn - zStr); } return SXRET_OK; } zIn++;
	}
	return SXERR_NOTFOUND;
}